

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f __thiscall Quat4f::lerp(Quat4f *this,Quat4f *q0,Quat4f *q1,float alpha)

{
  Quat4f QVar1;
  Quat4f local_54;
  Quat4f local_44;
  Quat4f local_34;
  float local_24;
  Quat4f *pQStack_20;
  float alpha_local;
  Quat4f *q1_local;
  Quat4f *q0_local;
  
  local_24 = alpha;
  pQStack_20 = q1;
  q1_local = q0;
  q0_local = this;
  ::operator-(&local_54,q1);
  ::operator*(alpha,&local_44);
  operator+(&local_34,q0);
  QVar1 = normalized(this);
  return (Quat4f)QVar1.m_elements;
}

Assistant:

Quat4f Quat4f::lerp( const Quat4f& q0, const Quat4f& q1, float alpha )
{
	return( ( q0 + alpha * ( q1 - q0 ) ).normalized() );
}